

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O3

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
set_delivery_filter(local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>
                    *this,type_index *msg_type,delivery_filter_t *filter,agent_t *subscriber)

{
  anon_class_16_2_d7f4d229 maker;
  
  maker.filter = filter;
  maker.subscriber = subscriber;
  insert_or_modify_subscriber<so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::set_delivery_filter(std::type_index_const&,so_5::delivery_filter_t_const&,so_5::agent_t&)::_lambda()_1_,so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::set_delivery_filter(std::type_index_const&,so_5::delivery_filter_t_const&,so_5::agent_t&)::_lambda(so_5::impl::local_mbox_details::subscriber_info_t&)_1_>
            (this,msg_type,subscriber,maker,(anon_class_8_1_552cbcb6)filter);
  return;
}

Assistant:

virtual void
		set_delivery_filter(
			const std::type_index & msg_type,
			const delivery_filter_t & filter,
			agent_t & subscriber ) override
			{
				insert_or_modify_subscriber(
						msg_type,
						&subscriber,
						[&] {
							return local_mbox_details::subscriber_info_t{
									&subscriber, &filter };
						},
						[&]( local_mbox_details::subscriber_info_t & info ) {
							info.set_filter( filter );
						} );
			}